

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  int iVar4;
  ImGuiDockNode *pIVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  ImGuiContext *g;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  ushort uVar13;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  ImGuiWindow *pIVar17;
  bool bVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 pos_old;
  ImVec2 size_old;
  
  pIVar7 = GImGui;
  if (host_node == (ImGuiDockNode *)0x0) {
    pIVar17 = (ImGuiWindow *)0x0;
    uVar11 = 0;
  }
  else {
    pIVar8 = (ImGuiWindow *)host_node;
    pIVar17 = (ImGuiWindow *)host_node;
    if ((host_node->field_0xb1 & 2) == 0) {
      do {
        pIVar17 = pIVar8;
        pIVar8 = *(ImGuiWindow **)&pIVar17->FlagsPreviousFrame;
      } while (*(ImGuiWindow **)&pIVar17->FlagsPreviousFrame != (ImGuiWindow *)0x0);
    }
    uVar11 = host_node->LocalFlags | host_node->SharedFlags;
  }
  pIVar5 = root_payload->DockNodeAsHost;
  data->IsCenterAvailable = true;
  if ((is_outer_docking) || ((host_node != (ImGuiDockNode *)0x0 && ((uVar11 & 0x10000) != 0)))) {
LAB_00167561:
    data->IsCenterAvailable = false;
LAB_00167568:
    data->IsSidesAvailable = true;
    if ((host_node == (ImGuiDockNode *)0x0) || ((uVar11 & 0x10) == 0)) goto LAB_00167580;
LAB_00167589:
    data->IsSidesAvailable = false;
LAB_0016758d:
    if (host_node != (ImGuiDockNode *)0x0) goto LAB_00167592;
    if (host_window->HasCloseButton == false) {
      iVar4._0_1_ = root_payload->HasCloseButton;
      iVar4._1_1_ = root_payload->ResizeBorderHeld;
      iVar4._2_2_ = root_payload->BeginCount;
      uVar10 = (ushort)*(undefined4 *)&(data->FutureNode).field_0xb0 & 0xf7ff |
               (ushort)(iVar4 << 0xb);
    }
    else {
      uVar10 = (ushort)*(undefined4 *)&(data->FutureNode).field_0xb0 | 0x800;
    }
    *(ushort *)&(data->FutureNode).field_0xb0 = uVar10;
    uVar13 = (ushort)((~host_window->Flags & 0x20U) << 7);
    pIVar17 = host_window;
  }
  else {
    if ((host_node != (ImGuiDockNode *)0x0) && ((uVar11 & 4) != 0)) {
      if ((host_node->LocalFlags & 0x800) == 0) goto LAB_00167bcd;
      goto LAB_00167561;
    }
    if (host_node != (ImGuiDockNode *)0x0) {
LAB_00167bcd:
      if (pIVar5 != (ImGuiDockNode *)0x0 &&
          ((host_node->Windows).Size != 0 || host_node->ChildNodes[0] != (ImGuiDockNode *)0x0))
      goto LAB_00167bf8;
      goto LAB_00167568;
    }
    if (pIVar5 != (ImGuiDockNode *)0x0) {
LAB_00167bf8:
      if ((pIVar5->ChildNodes[0] != (ImGuiDockNode *)0x0) &&
         (pIVar5->OnlyNodeWithWindows == (ImGuiDockNode *)0x0)) goto LAB_00167561;
      goto LAB_00167568;
    }
    data->IsSidesAvailable = true;
LAB_00167580:
    if ((pIVar7->IO).ConfigDockingNoSplit == true) goto LAB_00167589;
    if (host_node == (ImGuiDockNode *)0x0 || is_outer_docking) goto LAB_0016758d;
    if ((host_node->ParentNode == (ImGuiDockNode *)0x0) && ((host_node->LocalFlags & 0x800) != 0)) {
      data->IsSidesAvailable = false;
    }
LAB_00167592:
    if ((host_node->field_0xb1 & 8) == 0) {
      iVar3._0_1_ = root_payload->HasCloseButton;
      iVar3._1_1_ = root_payload->ResizeBorderHeld;
      iVar3._2_2_ = root_payload->BeginCount;
      uVar10 = (ushort)*(undefined4 *)&(data->FutureNode).field_0xb0 & 0xf7ff |
               (ushort)(iVar3 << 0xb);
    }
    else {
      uVar10 = (ushort)*(undefined4 *)&(data->FutureNode).field_0xb0 | 0x800;
    }
    *(ushort *)&(data->FutureNode).field_0xb0 = uVar10;
    uVar13 = 0x1000;
  }
  *(ushort *)&(data->FutureNode).field_0xb0 = uVar13 | uVar10 & 0xefff;
  (data->FutureNode).Pos = pIVar17->Pos;
  (data->FutureNode).Size = pIVar17->Size;
  data->SplitNode = host_node;
  data->SplitDir = -1;
  data->IsSplitDirExplicit = false;
  if (host_window->Collapsed == false) {
    uVar16 = 0xffffffff;
    lVar12 = 0;
    bVar18 = false;
    uVar11 = 0xffffffff;
    do {
      if (lVar12 == 0) {
        if (data->IsCenterAvailable != false) goto LAB_00167709;
        goto LAB_0016792e;
      }
      if (data->IsSidesAvailable != true) goto LAB_0016792e;
LAB_00167709:
      IVar2 = (data->FutureNode).Pos;
      fVar23 = IVar2.x;
      fVar25 = IVar2.y;
      IVar2 = (data->FutureNode).Size;
      fVar21 = IVar2.x + fVar23;
      fVar22 = IVar2.y + fVar25;
      fVar28 = fVar21 - fVar23;
      fVar29 = fVar22 - fVar25;
      fVar20 = fVar28;
      if (fVar29 <= fVar28) {
        fVar20 = fVar29;
      }
      fVar27 = pIVar7->FontSize;
      uVar19 = -(uint)(fVar20 * 0.125 <= fVar27 * 0.5);
      fVar26 = (float)(uVar19 & (uint)(fVar27 * 0.5) | ~uVar19 & (uint)(fVar20 * 0.125));
      fVar20 = fVar27 * 1.5;
      if (fVar26 <= fVar27 * 1.5) {
        fVar20 = fVar26;
      }
      if (is_outer_docking) {
        fVar26 = (float)(int)(fVar20 * 1.5);
        fVar20 = (float)(int)(fVar20 * 0.8);
        fVar24 = (pIVar7->Style).FramePadding.y;
        fVar24 = (fVar24 + fVar24 + fVar27 + (pIVar7->Style).ItemSpacing.y) * -0.0;
        fVar27 = (float)(int)((fVar28 * 0.5 + fVar24) - fVar20);
        fVar28 = (float)(int)((fVar29 * 0.5 + fVar24) - fVar20);
      }
      else {
        fVar26 = (float)(int)fVar20;
        fVar20 = (float)(int)(fVar20 * 0.9);
        fVar27 = (float)(int)(fVar26 * 2.4);
        fVar28 = fVar27;
      }
      fVar21 = (float)(int)((fVar23 + fVar21) * 0.5);
      fVar22 = (float)(int)((fVar25 + fVar22) * 0.5);
      if (lVar12 == 0) {
        fVar23 = fVar22 + fVar26;
        fVar28 = fVar22 - fVar26;
        goto LAB_001678c8;
      }
      switch(uVar16) {
      case 0:
        fVar25 = (fVar21 - fVar27) + fVar20;
        fVar23 = fVar22 + fVar26;
        fVar20 = (fVar21 - fVar27) - fVar20;
        fVar28 = fVar22 - fVar26;
        break;
      case 1:
        fVar25 = fVar27 + fVar21 + fVar20;
        fVar23 = fVar22 + fVar26;
        fVar20 = (fVar27 + fVar21) - fVar20;
        fVar28 = fVar22 - fVar26;
        break;
      case 2:
        fVar28 = fVar22 - fVar28;
        goto LAB_001678b7;
      case 3:
        fVar28 = fVar28 + fVar22;
LAB_001678b7:
        fVar23 = fVar28 + fVar20;
        fVar28 = fVar28 - fVar20;
LAB_001678c8:
        fVar25 = fVar21 + fVar26;
        fVar20 = fVar21 - fVar26;
        break;
      default:
        pfVar1 = (float *)((long)&data->DropRectsDraw[0].Min.x + lVar12);
        fVar20 = *pfVar1;
        fVar28 = pfVar1[1];
        fVar25 = pfVar1[2];
        fVar23 = pfVar1[3];
        goto LAB_001678d6;
      }
      pfVar1 = (float *)((long)&data->DropRectsDraw[0].Min.x + lVar12);
      *pfVar1 = fVar20;
      pfVar1[1] = fVar28;
      pfVar1[2] = fVar25;
      pfVar1[3] = fVar23;
LAB_001678d6:
      fVar29 = (pIVar7->IO).MousePos.x;
      if (is_outer_docking) {
LAB_001678e4:
        if ((((fVar20 <= fVar29) && (fVar20 = (pIVar7->IO).MousePos.y, fVar28 <= fVar20)) &&
            (fVar29 < fVar25)) && (fVar20 < fVar23)) {
LAB_0016791a:
          data->SplitDir = uVar16;
          data->IsSplitDirExplicit = true;
          bVar18 = true;
          uVar11 = uVar16;
        }
      }
      else {
        fVar21 = fVar29 - fVar21;
        fVar22 = (pIVar7->IO).MousePos.y - fVar22;
        fVar27 = fVar21 * fVar21 + fVar22 * fVar22;
        if (fVar26 * 1.4 * fVar26 * 1.4 <= fVar27) {
          if (fVar26 * 2.6 * fVar26 * 2.6 <= fVar27) {
            fVar21 = (float)(int)(fVar26 * 0.3);
            fVar25 = fVar25 + fVar21;
            fVar23 = fVar23 + fVar21;
            fVar20 = fVar20 - fVar21;
            fVar28 = fVar28 - fVar21;
            goto LAB_001678e4;
          }
          uVar19 = (uint)(0.0 < fVar21);
          if (ABS(fVar21) <= ABS(fVar22)) {
            uVar19 = 0.0 < fVar22 | 2;
          }
          if (uVar16 == uVar19) goto LAB_0016791a;
        }
        else if (lVar12 == 0) goto LAB_0016791a;
      }
LAB_0016792e:
      lVar12 = lVar12 + 0x10;
      uVar16 = uVar16 + 1;
    } while (lVar12 != 0x50);
    if (uVar11 == 0xffffffff) goto LAB_00167a5e;
    bVar15 = true;
    bVar6 = false;
  }
  else {
    bVar18 = false;
LAB_00167a5e:
    bVar15 = data->IsCenterAvailable;
    uVar11 = 0xffffffff;
    bVar6 = true;
  }
  data->IsDropAllowed = bVar15;
  if ((!is_explicit_target && !bVar18) && ((pIVar7->IO).ConfigDockingWithShift == false)) {
    data->IsDropAllowed = false;
  }
  data->SplitRatio = 0.0;
  if (bVar6) {
    return;
  }
  bVar18 = uVar11 < 2;
  uVar14 = (ulong)!bVar18;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_40 = (data->FutureNode).Pos;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_30 = (data->FutureNode).Size;
  local_28 = root_payload->Size;
  fVar21 = (pIVar7->Style).ItemInnerSpacing.x;
  (&local_38.x)[bVar18] = (&local_40.x)[bVar18];
  (&local_48.x)[bVar18] = (&local_30.x)[bVar18];
  uVar9 = (ulong)((uint)!bVar18 * 4);
  fVar22 = *(float *)((long)&local_30.x + uVar9) - fVar21;
  fVar20 = *(float *)((long)&local_28.x + uVar9);
  fVar23 = fVar22 * 0.5;
  if (fVar20 <= 0.0 || fVar23 < fVar20) {
    fVar20 = (float)(int)fVar23;
  }
  *(float *)((long)&local_48.x + uVar9) = fVar20;
  uVar11 = uVar11 & 0xfffffffd;
  if (uVar11 == 0) {
    fVar21 = (&local_40.x)[uVar14];
  }
  else {
    if (uVar11 != 1) goto LAB_00167b79;
    fVar21 = fVar21 + (float)(int)(fVar22 - fVar20) + (&local_40.x)[uVar14];
  }
  (&local_38.x)[uVar14] = fVar21;
LAB_00167b79:
  fVar20 = fVar20 / *(float *)((long)(data->FutureNode).ChildNodes + uVar14 * 4 + 0x30);
  fVar21 = 1.0;
  if (fVar20 <= 1.0) {
    fVar21 = fVar20;
  }
  fVar21 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar21);
  (data->FutureNode).Pos = local_38;
  (data->FutureNode).Size = local_48;
  if (uVar11 == 1) {
    fVar21 = 1.0 - fVar21;
  }
  data->SplitRatio = fVar21;
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags host_node_flags = host_node ? host_node->GetMergedFlags() : 0;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (host_node && (host_node_flags & ImGuiDockNodeFlags_NoDocking))
        data->IsCenterAvailable = false;
    else if (host_node && (host_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((host_node && (host_node_flags & ImGuiDockNodeFlags_NoSplit)) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = host_node ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = host_node ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}